

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

void helicsInputSetDefaultTime(HelicsInput inp,HelicsTime val,HelicsError *err)

{
  Input *this;
  HelicsInput in_RSI;
  Time tval;
  InputObject *inpObj;
  TimeRepresentation<count_time<9,_long>_> *in_stack_ffffffffffffffd8;
  HelicsError *in_stack_ffffffffffffffe0;
  
  this = (Input *)anon_unknown.dwarf_5d1c2::verifyInput(in_RSI,in_stack_ffffffffffffffe0);
  if (this != (Input *)0x0) {
    TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
              ((TimeRepresentation<count_time<9,_long>_> *)this,(double)in_stack_ffffffffffffffd8);
    helics::Input::setDefault<TimeRepresentation<count_time<9,long>>const&>
              (this,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void helicsInputSetDefaultTime(HelicsInput inp, HelicsTime val, HelicsError* err)
{
    auto* inpObj = verifyInput(inp, err);
    if (inpObj == nullptr) {
        return;
    }

    const helics::Time tval(val);
    inpObj->inputPtr->setDefault(tval);
}